

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_file_cache.cpp
# Opt level: O2

void __thiscall duckdb::ExternalFileCache::CachedFile::CachedFile(CachedFile *this,string *path_p)

{
  _Rb_tree_header *p_Var1;
  
  ::std::__cxx11::string::string((string *)this,(string *)path_p);
  StorageLock::StorageLock(&this->lock);
  p_Var1 = &(this->ranges)._M_t._M_impl.super__Rb_tree_header;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ranges)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->version_tag)._M_dataplus._M_p = (pointer)&(this->version_tag).field_2;
  (this->version_tag)._M_string_length = 0;
  (this->version_tag).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ExternalFileCache::CachedFile::CachedFile(string path_p) : path(std::move(path_p)) {
}